

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrExternalCameraOCULUS *value)

{
  NextChainResult NVar1;
  XrResult XVar2;
  size_t sVar3;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  allocator local_159;
  string *local_158;
  allocator local_149;
  string local_148;
  string error_message;
  string local_108;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_a8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_78;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_60;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  
  XVar2 = XR_SUCCESS;
  local_158 = command_name;
  if (value->type != XR_TYPE_EXTERNAL_CAMERA_OCULUS) {
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrExternalCameraOCULUS",value->type,
               "VUID-XrExternalCameraOCULUS-type-type",XR_TYPE_EXTERNAL_CAMERA_OCULUS,
               "XR_TYPE_EXTERNAL_CAMERA_OCULUS");
  }
  if (!check_pnext) goto LAB_00197813;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar1 = ValidateNextChain(instance_info,local_158,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar1 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_148);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_148,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::string
              ((string *)&local_148,"VUID-XrExternalCameraOCULUS-next-unique",&local_159);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_78,objects_info);
    std::__cxx11::string::string
              ((string *)&local_108,
               "Multiple structures of the same type(s) in \"next\" chain for XrExternalCameraOCULUS struct"
               ,&local_149);
    CoreValidLogMessage(instance_info,&local_148,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_78,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_78);
    std::__cxx11::string::~string((string *)&local_148);
LAB_001977de:
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar1 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrExternalCameraOCULUS-next-next",
               (allocator *)&local_108);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_60,objects_info);
    std::__cxx11::string::string
              ((string *)&local_148,
               "Invalid structure(s) in \"next\" chain for XrExternalCameraOCULUS struct \"next\"",
               &local_159);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_60,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_60);
    goto LAB_001977de;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_00197813:
  if (check_members && XVar2 == XR_SUCCESS) {
    sVar3 = strlen(value->name);
    if (sVar3 < 0x21) {
      XVar2 = ValidateXrStruct(instance_info,local_158,objects_info,true,false,&value->extrinsics);
      if (XVar2 == XR_SUCCESS) {
        return XR_SUCCESS;
      }
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrExternalCameraOCULUS-extrinsics-parameter",
                 (allocator *)&local_108);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_a8,objects_info);
      std::__cxx11::string::string
                ((string *)&local_148,
                 "Structure XrExternalCameraOCULUS member extrinsics is invalid",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_a8,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      this = &local_a8;
    }
    else {
      std::__cxx11::string::string
                ((string *)&error_message,"VUID-XrExternalCameraOCULUS-name-parameter",
                 (allocator *)&local_108);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_90,objects_info);
      std::__cxx11::string::string
                ((string *)&local_148,
                 "Structure XrExternalCameraOCULUS member name length is too long.",
                 (allocator *)&valid_ext_structs);
      CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_158,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_90,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      this = &local_90;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&error_message);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrExternalCameraOCULUS* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_EXTERNAL_CAMERA_OCULUS) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrExternalCameraOCULUS",
                             value->type, "VUID-XrExternalCameraOCULUS-type-type", XR_TYPE_EXTERNAL_CAMERA_OCULUS, "XR_TYPE_EXTERNAL_CAMERA_OCULUS");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrExternalCameraOCULUS-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrExternalCameraOCULUS struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrExternalCameraOCULUS : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrExternalCameraOCULUS-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrExternalCameraOCULUS struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    if (XR_MAX_EXTERNAL_CAMERA_NAME_SIZE_OCULUS < std::strlen(value->name)) {
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraOCULUS-name-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrExternalCameraOCULUS member name length is too long.");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Validate that the structure XrExternalCameraIntrinsicsOCULUS is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->intrinsics);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraOCULUS-intrinsics-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrExternalCameraOCULUS member intrinsics is invalid");
        return xr_result;
    }
    // Validate that the structure XrExternalCameraExtrinsicsOCULUS is valid
    xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                     check_members, true, &value->extrinsics);
    if (XR_SUCCESS != xr_result) {
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraOCULUS-extrinsics-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrExternalCameraOCULUS member extrinsics is invalid");
        return xr_result;
    }
    // Everything checked out properly
    return xr_result;
}